

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseDataArrayList
                 (char *in,char *end,ValueType type,DataArrayList **dataArrayList)

{
  DataArrayList *pDVar1;
  DataArrayList **ppDVar2;
  byte *pbVar3;
  byte *pbVar4;
  DataArrayList *pDVar5;
  Value *currentValue;
  size_t numValues;
  size_t numRefs;
  Reference *refs;
  Value *local_58;
  size_t local_50;
  size_t local_48;
  Reference *local_40;
  DataArrayList **local_38;
  
  if ((dataArrayList != (DataArrayList **)0x0) &&
     (*dataArrayList = (DataArrayList *)0x0, pbVar3 = (byte *)in, in != end && in != (char *)0x0)) {
    while (in = (char *)pbVar3, (ulong)(byte)*in < 0x2d) {
      if (((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0) ||
         (pbVar3 = (byte *)in + 1, in = end, pbVar3 == (byte *)end)) break;
    }
    if (*in == 0x7b) {
      pbVar3 = (byte *)in + 1;
      local_40 = (Reference *)0x0;
      pDVar5 = (DataArrayList *)0x0;
      local_38 = dataArrayList;
      do {
        local_48 = 0;
        local_50 = 0;
        local_58 = (Value *)0x0;
        pbVar3 = (byte *)parseDataList((char *)pbVar3,end,type,&local_58,&local_50,&local_40,
                                       &local_48);
        pDVar1 = pDVar5;
        if (local_58 != (Value *)0x0 || local_48 != 0) {
          pDVar1 = createDataArrayList(local_58,local_50,local_40,local_48);
          ppDVar2 = &pDVar5->m_next;
          if (pDVar5 == (DataArrayList *)0x0) {
            ppDVar2 = local_38;
          }
          *ppDVar2 = pDVar1;
        }
        pbVar4 = pbVar3;
      } while ((pbVar3 != (byte *)end) && (pDVar5 = pDVar1, *pbVar3 == 0x2c));
      while ((pbVar3 != (byte *)end &&
             ((pbVar4 = pbVar3, (ulong)*pbVar3 < 0x2d &&
              ((0x100100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))))) {
        pbVar3 = pbVar3 + 1;
        pbVar4 = (byte *)end;
      }
      in = (char *)(pbVar4 + 1);
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseDataArrayList( char *in, char *end,Value::ValueType type, 
                                         DataArrayList **dataArrayList ) {
    if ( ddl_nullptr == dataArrayList ) {
        return in;
    }

    *dataArrayList = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == Grammar::OpenBracketToken[ 0 ] ) {
        ++in;
        Value *currentValue( ddl_nullptr );
        Reference *refs( ddl_nullptr );
        DataArrayList *prev( ddl_nullptr ), *currentDataList( ddl_nullptr );
        do {
            size_t numRefs( 0 ), numValues( 0 );
            currentValue = ddl_nullptr;

            in = parseDataList( in, end, type, &currentValue, numValues, &refs, numRefs );
            if( ddl_nullptr != currentValue || 0 != numRefs ) {
                if( ddl_nullptr == prev ) {
                    *dataArrayList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    prev = *dataArrayList;
                } else {
                    currentDataList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    if( ddl_nullptr != prev ) {
                        prev->m_next = currentDataList;
                        prev = currentDataList;
                    }
                }
            }
        } while( Grammar::CommaSeparator[ 0 ] == *in && in != end );
        in = lookForNextToken( in, end );
        ++in;
    }

    return in;
}